

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsElfFile.cpp
# Opt level: O1

bool __thiscall MipsElfFile::seekPhysical(MipsElfFile *this,int64_t physicalAddress)

{
  ElfSegment *pEVar1;
  pointer ppEVar2;
  ElfSection *pEVar3;
  bool bVar4;
  byte in_AL;
  pointer ppEVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  
  ppEVar5 = (this->elf).segments.super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  bVar11 = (this->elf).segments.super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>.
           _M_impl.super__Vector_impl_data._M_finish != ppEVar5;
  if (bVar11) {
    uVar10 = 0;
    do {
      pEVar1 = ppEVar5[uVar10];
      uVar8 = (ulong)(pEVar1->header).p_offset;
      bVar4 = physicalAddress < (long)((pEVar1->header).p_filesz + uVar8);
      if (bVar4 && (long)uVar8 <= physicalAddress) {
        ppEVar2 = (pEVar1->sections).super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar6 = (long)(pEVar1->sections).
                      super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppEVar2;
        bVar12 = lVar6 != 0;
        if (bVar12) {
          uVar7 = lVar6 >> 3;
          uVar9 = 0;
          do {
            pEVar3 = ppEVar2[uVar9];
            lVar6 = (pEVar3->header).sh_offset + uVar8;
            if (physicalAddress < (long)((ulong)(pEVar3->header).sh_size + lVar6) &&
                lVar6 <= physicalAddress) {
              this->segment = (int)uVar10;
              this->section = (int)uVar9;
              this->sectionOffset = physicalAddress - lVar6;
              in_AL = 1;
              break;
            }
            uVar9 = uVar9 + 1;
            bVar12 = uVar9 < uVar7;
          } while (uVar7 + (uVar7 == 0) != uVar9);
        }
        if (!bVar12) {
          Logger::queueError<>(Error,"Found segment, but no containing section");
          in_AL = 0;
        }
      }
      if (bVar4 && (long)uVar8 <= physicalAddress) break;
      uVar10 = uVar10 + 1;
      ppEVar5 = (this->elf).segments.super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      bVar11 = uVar10 < (ulong)((long)(this->elf).segments.
                                      super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar5 >>
                               3);
    } while (bVar11);
  }
  if (!bVar11) {
    ppEVar2 = (this->elf).segmentlessSections.
              super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar6 = (long)(this->elf).segmentlessSections.
                  super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)ppEVar2;
    bVar11 = lVar6 != 0;
    if (bVar11) {
      uVar10 = lVar6 >> 3;
      uVar8 = 0;
      do {
        pEVar3 = ppEVar2[uVar8];
        uVar7 = (ulong)(pEVar3->header).sh_offset;
        if (physicalAddress < (long)((pEVar3->header).sh_size + uVar7) &&
            (long)uVar7 <= physicalAddress) {
          this->segment = -1;
          this->section = (int)uVar8;
          this->sectionOffset = physicalAddress - uVar7;
          in_AL = 1;
          break;
        }
        uVar8 = uVar8 + 1;
        bVar11 = uVar8 < uVar10;
      } while (uVar10 + (uVar10 == 0) != uVar8);
    }
    if (!bVar11) {
      this->segment = -1;
      this->section = -1;
      Logger::queueError<>(Error,"Couldn\'t find a section");
      in_AL = 0;
    }
  }
  return (bool)(in_AL & 1);
}

Assistant:

bool MipsElfFile::seekPhysical(int64_t physicalAddress)
{
	// search in segments
	for (size_t i = 0; i < elf.getSegmentCount(); i++)
	{
		ElfSegment* seg = elf.getSegment(i);
		int64_t segStart = seg->getOffset();
		int64_t segEnd = segStart+seg->getPhysSize();

		if (segStart <= physicalAddress && physicalAddress < segEnd)
		{
			// find section
			for (size_t l = 0; l < seg->getSectionCount(); l++)
			{
				ElfSection* sect = seg->getSection(l);
				int64_t sectStart = segStart+sect->getOffset();
				int64_t sectEnd = sectStart+sect->getSize();
				
				if (sectStart <= physicalAddress && physicalAddress < sectEnd)
				{
					segment = (int) i;
					section = (int) l;
					sectionOffset = physicalAddress-sectStart;
					return true;
				}
			}

			Logger::queueError(Logger::Error, "Found segment, but no containing section");
			return false;
		}
	}

	// search in segmentless sections
	for (size_t i = 0; i < elf.getSegmentlessSectionCount(); i++)
	{
		ElfSection* sect = elf.getSegmentlessSection(i);
		int64_t sectStart = sect->getOffset();
		int64_t sectEnd = sectStart+sect->getSize();
		
		if (sectStart <= physicalAddress && physicalAddress < sectEnd)
		{
			segment = -1;
			section = (int) i;
			sectionOffset = physicalAddress-sectStart;
			return true;
		}
	}

	segment = -1;
	section = -1;
	Logger::queueError(Logger::Error, "Couldn't find a section");
	return false;
}